

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

void __thiscall
jsonnet::internal::FixTrailingCommas::remove_comma
          (FixTrailingCommas *this,Fodder *last_comma_fodder,bool *trailing_comma,
          Fodder *close_fodder)

{
  pointer pFVar1;
  pointer pFVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pFVar6;
  bool bVar7;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_58;
  vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  local_40;
  
  if (*trailing_comma == true) {
    *trailing_comma = false;
    if ((last_comma_fodder->
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        )._M_impl.super__Vector_impl_data._M_finish ==
        (last_comma_fodder->
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector(&local_58,close_fodder);
      local_40.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (close_fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      pFVar1 = (close_fodder->
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pFVar2 = (close_fodder->
               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      vector(&local_58,last_comma_fodder);
      local_40.
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (close_fodder->
           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
           )._M_impl.super__Vector_impl_data._M_start;
      if (pFVar1 != pFVar2) {
        fodder_push_back(&local_58,
                         local_40.
                         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        local_40.
        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (close_fodder->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_start;
        if (1 < (ulong)(((long)(close_fodder->
                               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_40.
                               super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333
                       )) {
          uVar4 = 1;
          uVar5 = 2;
          do {
            std::
            vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ::push_back(&local_58,
                        local_40.
                        super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar4);
            local_40.
            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (close_fodder->
                 super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                 )._M_impl.super__Vector_impl_data._M_start;
            uVar4 = ((long)(close_fodder->
                           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_40.
                           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
            bVar7 = uVar5 <= uVar4;
            lVar3 = uVar4 - uVar5;
            uVar4 = uVar5;
            uVar5 = (ulong)((int)uVar5 + 1);
          } while (bVar7 && lVar3 != 0);
        }
      }
    }
    local_40.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (close_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_40.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (close_fodder->
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (close_fodder->
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_58.
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (close_fodder->
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (close_fodder->
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.
         super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&local_40);
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::~vector(&local_58);
    pFVar1 = (last_comma_fodder->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pFVar2 = (last_comma_fodder->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pFVar6 = pFVar1;
    if (pFVar2 != pFVar1) {
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&pFVar6->comment);
        pFVar6 = pFVar6 + 1;
      } while (pFVar6 != pFVar2);
      (last_comma_fodder->
      super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
      )._M_impl.super__Vector_impl_data._M_finish = pFVar1;
    }
  }
  return;
}

Assistant:

void remove_comma(Fodder &last_comma_fodder, bool &trailing_comma, Fodder &close_fodder)
    {
        if (trailing_comma) {
            // Remove it but keep fodder.
            trailing_comma = false;
            close_fodder = concat_fodder(last_comma_fodder, close_fodder);
            last_comma_fodder.clear();
        }
    }